

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O0

void __thiscall wasm::LocalGetCounter::LocalGetCounter(LocalGetCounter *this,Function *func)

{
  Function *func_local;
  LocalGetCounter *this_local;
  
  PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::PostWalker
            (&this->
              super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->num);
  analyze(this,func,func->body);
  return;
}

Assistant:

LocalGetCounter(Function* func) { analyze(func, func->body); }